

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_timing.cpp
# Opt level: O3

void __thiscall
Am_Interactor_Time_Event::Am_Interactor_Time_Event
          (Am_Interactor_Time_Event *this,Am_Time *new_delta,Am_Object *obj,Am_Slot_Key key,
          bool once)

{
  Am_Time *this_00;
  Am_Time *this_01;
  Am_Time AStack_48;
  Am_Time *local_40;
  Am_Time *local_38;
  
  (this->object).data = (Am_Object_Data *)0x0;
  local_40 = &this->delta;
  Am_Time::Am_Time(local_40);
  local_38 = &this->next_timeout;
  Am_Time::Am_Time(local_38);
  this_00 = &this->start_time;
  Am_Time::Am_Time(this_00);
  Am_Time::operator=(local_40,new_delta);
  Am_Object::operator=(&this->object,obj);
  this->method_slot = key;
  this->only_once = once;
  am_clock();
  this_01 = local_38;
  Am_Time::operator=(this_00,&AStack_48);
  Am_Time::~Am_Time(&AStack_48);
  Am_Time::operator+(&AStack_48,this_00);
  Am_Time::operator=(this_01,&AStack_48);
  Am_Time::~Am_Time(&AStack_48);
  return;
}

Assistant:

Am_Interactor_Time_Event(Am_Time new_delta, Am_Object obj, Am_Slot_Key key,
                           bool once)
  {
    delta = new_delta;
    object = obj;
    method_slot = key;
    only_once = once;
    start_time = am_clock();
    next_timeout = start_time + delta;
  }